

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

void duckdb::StandardFixedSizeAppend::Append<unsigned_short>
               (SegmentStatistics *stats,data_ptr_t target,idx_t target_offset,
               UnifiedVectorFormat *adata,idx_t offset,idx_t count)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short *puVar3;
  idx_t iVar4;
  long lVar5;
  BaseStatistics *this;
  UnifiedVectorFormat *in_RCX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  long in_R8;
  ulong in_R9;
  idx_t target_idx_1;
  idx_t source_idx_1;
  idx_t i_1;
  bool is_null;
  idx_t target_idx;
  idx_t source_idx;
  idx_t i;
  unsigned_short *tdata;
  unsigned_short *sdata;
  undefined8 in_stack_ffffffffffffff88;
  BaseStatistics *in_stack_ffffffffffffff90;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  ulong uVar6;
  ulong local_48;
  
  puVar3 = UnifiedVectorFormat::GetData<unsigned_short>(in_RCX);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    (&(in_RCX->validity).super_TemplatedValidityMask<unsigned_long>);
  if (bVar1) {
    for (uVar6 = 0; uVar6 < in_R9; uVar6 = uVar6 + 1) {
      this = (BaseStatistics *)SelectionVector::get_index(in_RCX->sel,in_R8 + uVar6);
      lVar5 = CONCAT62(in_register_00000012,in_DX) + uVar6;
      BaseStatistics::UpdateNumericStats<unsigned_short>
                (this,(unsigned_short)((ulong)lVar5 >> 0x30));
      *(unsigned_short *)(in_RSI + lVar5 * 2) = puVar3[(long)this];
    }
  }
  else {
    for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
      iVar4 = SelectionVector::get_index(in_RCX->sel,in_R8 + local_48);
      lVar5 = CONCAT62(in_register_00000012,in_DX) + local_48;
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        BaseStatistics::UpdateNumericStats<unsigned_short>
                  (in_stack_ffffffffffffff90,
                   (unsigned_short)((ulong)in_stack_ffffffffffffff88 >> 0x30));
        *(unsigned_short *)(in_RSI + lVar5 * 2) = puVar3[iVar4];
      }
      else {
        uVar2 = NullValue<unsigned_short>();
        *(unsigned_short *)(in_RSI + lVar5 * 2) = uVar2;
      }
    }
  }
  return;
}

Assistant:

static void Append(SegmentStatistics &stats, data_ptr_t target, idx_t target_offset, UnifiedVectorFormat &adata,
	                   idx_t offset, idx_t count) {
		auto sdata = UnifiedVectorFormat::GetData<T>(adata);
		auto tdata = reinterpret_cast<T *>(target);
		if (!adata.validity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				bool is_null = !adata.validity.RowIsValid(source_idx);
				if (!is_null) {
					stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
					tdata[target_idx] = sdata[source_idx];
				} else {
					// we insert a NullValue<T> in the null gap for debuggability
					// this value should never be used or read anywhere
					tdata[target_idx] = NullValue<T>();
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto source_idx = adata.sel->get_index(offset + i);
				auto target_idx = target_offset + i;
				stats.statistics.UpdateNumericStats<T>(sdata[source_idx]);
				tdata[target_idx] = sdata[source_idx];
			}
		}
	}